

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

StringRef __thiscall
Catch::anon_unknown_26::extractFilenamePart(anon_unknown_26 *this,StringRef filename)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  anon_unknown_26 *paVar4;
  long lVar5;
  char *pcVar6;
  size_t lastDot;
  char *pcVar8;
  anon_unknown_26 *paVar9;
  char *pcVar10;
  StringRef SVar11;
  char *pcVar7;
  
  pcVar8 = filename.m_start;
  lVar5 = 0;
  do {
    paVar4 = (anon_unknown_26 *)0x180e1d;
    pcVar7 = (char *)0x0;
    if (pcVar8 + lVar5 == (char *)0x0) goto LAB_00140885;
    lVar1 = lVar5 + -1;
    lVar2 = lVar5 + -1;
    lVar5 = lVar1;
  } while ((this + (long)pcVar8)[lVar2] != (anon_unknown_26)0x2e);
  pcVar7 = (char *)0x0;
  paVar4 = this + (long)pcVar8 + lVar1;
  pcVar3 = (char *)-lVar1;
  do {
    pcVar10 = pcVar3;
    paVar9 = paVar4;
    pcVar6 = pcVar7;
    if ((pcVar8 == pcVar10) || (paVar9[-1] == (anon_unknown_26)0x5c)) break;
    pcVar7 = pcVar6 + 1;
    paVar4 = paVar9 + -1;
    pcVar3 = pcVar10 + 1;
  } while (paVar9[-1] != (anon_unknown_26)0x2f);
  if (pcVar10 < pcVar6) {
    pcVar6 = pcVar10;
  }
  paVar4 = (anon_unknown_26 *)0x180e1d;
  pcVar7 = (char *)0x0;
  if (pcVar8 + -(long)pcVar10 < pcVar8) {
    paVar4 = paVar9;
    pcVar7 = pcVar6;
  }
LAB_00140885:
  SVar11.m_size = (size_type)pcVar7;
  SVar11.m_start = (char *)paVar4;
  return SVar11;
}

Assistant:

StringRef extractFilenamePart(StringRef filename) {
            size_t lastDot = filename.size();
            while (lastDot > 0 && filename[lastDot - 1] != '.') {
                --lastDot;
            }
            // In theory we could have filename without any extension in it
            if ( lastDot == 0 ) { return StringRef(); }

            --lastDot;
            size_t nameStart = lastDot;
            while (nameStart > 0 && filename[nameStart - 1] != '/' && filename[nameStart - 1] != '\\') {
                --nameStart;
            }

            return filename.substr(nameStart, lastDot - nameStart);
        }